

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  uint uVar2;
  Nonnull<const_char_*> pcVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  output->cur_ = pbVar6;
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar2 = (uint)uVar4;
      *pbVar6 = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      pbVar6 = pbVar6 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar6 = (byte)uVar4;
  output->cur_ = pbVar6 + 1;
  if ((value->_M_string_length & 0xffffffff80000000) == 0) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (value->_M_string_length,0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    WriteBytes();
  }
  uVar2 = (uint)value->_M_string_length;
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  output->cur_ = pbVar6;
  uVar5 = uVar2;
  if (0x7f < uVar2) {
    do {
      *pbVar6 = (byte)uVar5 | 0x80;
      uVar2 = uVar5 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar2;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar2;
  pbVar6 = pbVar6 + 1;
  output->cur_ = pbVar6;
  data = (value->_M_dataplus)._M_p;
  uVar2 = (uint)value->_M_string_length;
  if ((long)(output->impl_).end_ - (long)pbVar6 < (long)(int)uVar2) {
    pbVar6 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,uVar2,pbVar6);
  }
  else {
    memcpy(pbVar6,data,(ulong)uVar2);
    pbVar6 = pbVar6 + (int)uVar2;
  }
  output->cur_ = pbVar6;
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}